

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_pollset_change(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,int add_flags,
                        int remove_flags)

{
  uint local_28;
  uint i;
  int remove_flags_local;
  int add_flags_local;
  curl_socket_t sock_local;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  
  if (-1 < sock) {
    for (local_28 = 0; local_28 < ps->num; local_28 = local_28 + 1) {
      if (ps->sockets[local_28] == sock) {
        ps->actions[local_28] = ps->actions[local_28] & ((byte)remove_flags ^ 0xff);
        ps->actions[local_28] = ps->actions[local_28] | (byte)add_flags;
        if (ps->actions[local_28] != '\0') {
          return;
        }
        if (local_28 + 1 < ps->num) {
          memmove(ps->sockets + local_28,ps->sockets + (local_28 + 1),
                  (ulong)(ps->num - (local_28 + 1)) << 2);
          memmove(ps->actions + local_28,ps->actions + (local_28 + 1),
                  (ulong)(ps->num - (local_28 + 1)));
        }
        ps->num = ps->num - 1;
        return;
      }
    }
    if ((add_flags != 0) && (local_28 < 5)) {
      ps->sockets[local_28] = sock;
      ps->actions[local_28] = (byte)add_flags;
      ps->num = local_28 + 1;
    }
  }
  return;
}

Assistant:

void Curl_pollset_change(struct Curl_easy *data,
                       struct easy_pollset *ps, curl_socket_t sock,
                       int add_flags, int remove_flags)
{
  unsigned int i;

  (void)data;
  DEBUGASSERT(VALID_SOCK(sock));
  if(!VALID_SOCK(sock))
    return;

  DEBUGASSERT(add_flags <= (CURL_POLL_IN|CURL_POLL_OUT));
  DEBUGASSERT(remove_flags <= (CURL_POLL_IN|CURL_POLL_OUT));
  DEBUGASSERT((add_flags&remove_flags) == 0); /* no overlap */
  for(i = 0; i < ps->num; ++i) {
    if(ps->sockets[i] == sock) {
      ps->actions[i] &= (unsigned char)(~remove_flags);
      ps->actions[i] |= (unsigned char)add_flags;
      /* all gone? remove socket */
      if(!ps->actions[i]) {
        if((i + 1) < ps->num) {
          memmove(&ps->sockets[i], &ps->sockets[i + 1],
                  (ps->num - (i + 1)) * sizeof(ps->sockets[0]));
          memmove(&ps->actions[i], &ps->actions[i + 1],
                  (ps->num - (i + 1)) * sizeof(ps->actions[0]));
        }
        --ps->num;
      }
      return;
    }
  }
  /* not present */
  if(add_flags) {
    /* Having more SOCKETS per easy handle than what is defined
     * is a programming error. This indicates that we need
     * to raise this limit, making easy_pollset larger.
     * Since we use this in tight loops, we do not want to make
     * the pollset dynamic unnecessarily.
     * The current maximum in practise is HTTP/3 eyeballing where
     * we have up to 4 sockets involved in connection setup.
     */
    DEBUGASSERT(i < MAX_SOCKSPEREASYHANDLE);
    if(i < MAX_SOCKSPEREASYHANDLE) {
      ps->sockets[i] = sock;
      ps->actions[i] = (unsigned char)add_flags;
      ps->num = i + 1;
    }
  }
}